

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  Boxed_Value *param;
  _Alloc_hider _Var1;
  bool bVar2;
  char_type *pcVar3;
  reference pvVar4;
  eval_error *this_00;
  int iVar5;
  string_view t_match;
  undefined8 local_120;
  char_type *local_118;
  char_type *local_110;
  int local_108;
  Depth_Counter dc;
  Position start;
  string match;
  Position end;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cparser;
  
  Depth_Counter::Depth_Counter(&dc,this);
  SkipWS(this,false);
  start.line = (this->m_position).line;
  start.col = (this->m_position).col;
  start.m_pos = (this->m_position).m_pos;
  start.m_end = (this->m_position).m_end;
  start.m_last_col = (this->m_position).m_last_col;
  start._28_4_ = *(undefined4 *)&(this->m_position).field_0x1c;
  bVar2 = Single_Quoted_String_(this);
  if (bVar2) {
    match._M_dataplus._M_p = (pointer)&match.field_2;
    match._M_string_length = 0;
    cparser.match = &match;
    cparser.octal_matches._M_dataplus._M_p = (pointer)&cparser.octal_matches.field_2;
    cparser.unicode_size = 0;
    cparser.is_hex = false;
    cparser.is_escaped = false;
    cparser.is_interpolated = false;
    cparser.saw_interpolation_marker = false;
    cparser.is_octal = false;
    cparser.interpolation_allowed = false;
    cparser.octal_matches._M_string_length = 0;
    match.field_2._M_local_buf[0] = '\0';
    cparser.octal_matches.field_2._M_local_buf[0] = '\0';
    cparser.hex_matches._M_dataplus._M_p = (pointer)&cparser.hex_matches.field_2;
    cparser.hex_matches._M_string_length = 0;
    cparser.hex_matches.field_2._M_local_buf[0] = '\0';
    Position::operator+((Position *)&local_120,&start,1);
    Position::operator-(&end,&this->m_position,1);
    while (local_118 != end.m_pos) {
      pcVar3 = local_118;
      if (local_118 == local_110) {
        pcVar3 = "";
      }
      Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::parse(&cparser,*pcVar3,start.line,start.col,
              (this->m_filename).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr);
      if (local_118 != local_110) {
        if (*local_118 == '\n') {
          local_120._0_4_ = (int)local_120 + 1;
          local_108 = local_120._4_4_;
          iVar5 = 1;
        }
        else {
          iVar5 = local_120._4_4_ + 1;
        }
        local_120._4_4_ = iVar5;
        local_118 = local_118 + 1;
      }
    }
    Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Char_Parser(&cparser);
    _Var1 = match._M_dataplus;
    if (match._M_string_length != 1) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cparser,"Single-quoted strings must be 1 character long",
                 (allocator<char> *)&end);
      local_120._0_4_ = (this->m_position).line;
      local_120._4_4_ = (this->m_position).col;
      exception::eval_error::eval_error
                (this_00,(string *)&cparser,(File_Position *)&local_120,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    iVar5 = start.line;
    param = (Boxed_Value *)((ulong)start._0_8_ >> 0x20);
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&match,0);
    end.line._0_1_ = *pvVar4;
    detail::const_var_impl<char>((char *)&cparser);
    t_match._M_str = (char *)0x1;
    t_match._M_len = (size_t)this;
    ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    make_node<chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::Boxed_Value>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)&local_120,t_match,(int)_Var1._M_p,iVar5,param);
    std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
    ::
    emplace_back<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>
              ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
                *)&this->m_match_stack,
               (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                *)&local_120);
    if (local_120 != (File_Position)0x0) {
      (**(code **)(*(long *)local_120 + 0x18))();
    }
    local_120._0_4_ = 0;
    local_120._4_4_ = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cparser.is_escaped);
    std::__cxx11::string::~string((string *)&match);
  }
  (dc.parser)->m_current_parse_depth = (dc.parser)->m_current_parse_depth - 1;
  return bVar2;
}

Assistant:

bool Single_Quoted_String() {
        Depth_Counter dc{this};
        SkipWS();

        const auto start = m_position;
        if (Single_Quoted_String_()) {
          std::string match;

          {
            // scope for cparser destructor
            Char_Parser<std::string> cparser(match, false);

            for (auto s = start + 1, end = m_position - 1; s != end; ++s) {
              cparser.parse(*s, start.line, start.col, *m_filename);
            }
          }

          if (match.size() != 1) {
            throw exception::eval_error("Single-quoted strings must be 1 character long",
                                        File_Position(m_position.line, m_position.col),
                                        *m_filename);
          }

          m_match_stack.push_back(make_node<eval::Constant_AST_Node<Tracer>>(match, start.line, start.col, const_var(char(match.at(0)))));
          return true;
        } else {
          return false;
        }
      }